

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O2

void __thiscall
JetHead::list<EventDispatcherHelper::EventListenerNode_*>::~list
          (list<EventDispatcherHelper::EventListenerNode_*> *this)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar2 = this->mHead;
  while (pNVar2 != (Node *)0x0) {
    pNVar1 = pNVar2->next;
    operator_delete(pNVar2,0x18);
    this->mHead = pNVar1;
    pNVar2 = pNVar1;
  }
  this->mTail = (Node *)0x0;
  return;
}

Assistant:

~list()
		{
			while (mHead != NULL)
			{
				Node* temp = mHead->next;
				delete mHead;
				mHead = temp;
			}
			mTail = NULL;
		}